

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# was_added.c
# Opt level: O0

int find_added(pair_t *l,uint32 s)

{
  bool bVar1;
  pair_t *local_28;
  pair_t *c;
  uint32 s_local;
  pair_t *l_local;
  
  local_28 = l;
  while( true ) {
    bVar1 = false;
    if (local_28 != (pair_t *)0x0) {
      bVar1 = local_28->src_id != s;
    }
    if (!bVar1) break;
    local_28 = local_28->next;
  }
  l_local._4_4_ = (uint)(local_28 != (pair_t *)0x0);
  return l_local._4_4_;
}

Assistant:

int
find_added(pair_t *l, uint32 s)
{
    pair_t *c;

    for (c = l; c && (c->src_id != s); c = c->next);

    if (c == NULL) {
	/* either L is an empty list or S is not on the list */
	return FALSE;
    }
    else {
	return TRUE;
    }
}